

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

tnt_error tnt_io_xbufmax(tnt_stream_net *s,int opt,int min)

{
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  int iVar3;
  int iVar4;
  undefined8 uStack_38;
  
  iVar4 = 0x4000;
  if (min != 0) {
    iVar4 = min;
  }
  iVar1 = 0x8000000;
  uStack_38 = in_RAX;
  while (iVar3 = iVar1, iVar4 <= iVar3) {
    uStack_38 = CONCAT44((uint)(iVar3 + iVar4) >> 1,(undefined4)uStack_38);
    uVar2 = setsockopt(s->fd,1,opt,(void *)((long)&uStack_38 + 4),4);
    in_RAX = (ulong)uVar2;
    iVar1 = uStack_38._4_4_ + -1;
    if (uVar2 == 0) {
      iVar4 = uStack_38._4_4_ + 1;
      iVar1 = iVar3;
    }
  }
  return (tnt_error)in_RAX;
}

Assistant:

static enum tnt_error tnt_io_xbufmax(struct tnt_stream_net *s, int opt, int min) {
	int max = 128 * 1024 * 1024;
	if (min == 0)
		min = 16384;
	unsigned int avg = 0;
	while (min <= max) {
		avg = ((unsigned int)(min + max)) / 2;
		if (setsockopt(s->fd, SOL_SOCKET, opt, &avg, sizeof(avg)) == 0)
			min = avg + 1;
		else
			max = avg - 1;
	}
	return TNT_EOK;
}